

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deck.cpp
# Opt level: O3

void __thiscall Deck::Deck(Deck *this)

{
  pointer *ppCVar1;
  iterator __position;
  uint i;
  int iVar2;
  uint j;
  int iVar3;
  Card card;
  int local_40;
  int local_3c;
  Card local_38;
  
  (this->m_deck).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_deck).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_deck).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar2 = 0;
  do {
    iVar3 = 0;
    do {
      local_40 = iVar3;
      local_3c = iVar2;
      Card::Card(&local_38,&local_3c,&local_40);
      __position._M_current =
           (this->m_deck).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_deck).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Card,std::allocator<Card>>::_M_realloc_insert<Card_const&>
                  ((vector<Card,std::allocator<Card>> *)this,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        ppCVar1 = &(this->m_deck).super__Vector_base<Card,_std::allocator<Card>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != 0xd);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 4);
  return;
}

Assistant:

Deck::Deck()
{
    for (unsigned int i(0); i < SUIT_MAX; ++i)
    {
        for (unsigned int j(0); j < RANK_MAX; ++j)
        {
            Card card(i, j);
            m_deck.push_back(card);
        }
    }
}